

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double_sprintf<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec,basic_buffer<char> *buffer)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char_type format [10];
  char local_2a [10];
  double local_20;
  
  local_20 = value;
  if (buffer->capacity_ == 0) {
    __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0xb73,
                  "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<char>>, T = double]"
                 );
  }
  local_2a[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pcVar2 = local_2a + 1;
  }
  else {
    pcVar2 = local_2a + 2;
    local_2a[1] = 0x23;
  }
  if (-1 < spec->precision_) {
    pcVar2[0] = '.';
    pcVar2[1] = '*';
    pcVar2 = pcVar2 + 2;
  }
  *pcVar2 = spec->type_;
  pcVar2[1] = '\0';
LAB_0018b472:
  uVar1 = internal::char_traits<char>::format_float<double>
                    (buffer->ptr_,buffer->capacity_,local_2a,spec->precision_,local_20);
  if ((int)uVar1 < 0) goto LAB_0018b49c;
  if ((ulong)uVar1 < buffer->capacity_) {
    buffer->size_ = (ulong)uVar1;
    return;
  }
  uVar3 = (ulong)(uVar1 + 1);
  goto LAB_0018b4a9;
LAB_0018b49c:
  if (buffer->capacity_ != 0xffffffffffffffff) {
    uVar3 = buffer->capacity_ + 1;
LAB_0018b4a9:
    (**buffer->_vptr_basic_buffer)(buffer,uVar3);
  }
  goto LAB_0018b472;
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}